

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

void visit_loop_stmt(gvisitor_t *self,gnode_loop_stmt_t *node)

{
  gtoken_t gVar1;
  gtoken_t type;
  gnode_loop_stmt_t *node_local;
  gvisitor_t *self_local;
  
  gVar1 = (node->base).token.type;
  if (((gVar1 != TOK_KEY_WHILE) && (gVar1 != TOK_KEY_REPEAT)) && (gVar1 != TOK_KEY_FOR)) {
    __assert_fail("(type == TOK_KEY_WHILE) || (type == TOK_KEY_REPEAT) || (type == TOK_KEY_FOR)",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
                  ,0x310,"void visit_loop_stmt(gvisitor_t *, gnode_loop_stmt_t *)");
  }
  if (gVar1 == TOK_KEY_WHILE) {
    visit_loop_while_stmt(self,node);
  }
  else if (gVar1 == TOK_KEY_REPEAT) {
    visit_loop_repeat_stmt(self,node);
  }
  else if (gVar1 == TOK_KEY_FOR) {
    visit_loop_for_stmt(self,node);
  }
  return;
}

Assistant:

static void visit_loop_stmt (gvisitor_t *self, gnode_loop_stmt_t *node) {
    DEBUG_CODEGEN("visit_loop_stmt");

    gtoken_t type = NODE_TOKEN_TYPE(node);
    assert((type == TOK_KEY_WHILE) || (type == TOK_KEY_REPEAT) || (type == TOK_KEY_FOR));

    if (type == TOK_KEY_WHILE) {
        visit_loop_while_stmt(self, node);
    } else if (type == TOK_KEY_REPEAT) {
        visit_loop_repeat_stmt(self, node);
    } else if (type == TOK_KEY_FOR) {
        visit_loop_for_stmt(self, node);
    }
}